

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ConvolutionLayerParams::ByteSizeLong(ConvolutionLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->kernelsize_);
  iVar6 = 0;
  if (sVar1 == 0) {
    iVar5 = 0;
    lVar4 = 0;
  }
  else {
    iVar5 = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    lVar4 = sVar2 + 2;
  }
  this->_kernelsize_cached_byte_size_ = iVar5;
  lVar4 = lVar4 + sVar1;
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->stride_);
  if (sVar1 != 0) {
    iVar6 = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar6);
    lVar4 = lVar4 + sVar2 + 2;
  }
  this->_stride_cached_byte_size_ = iVar6;
  lVar4 = lVar4 + sVar1;
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->dilationfactor_);
  iVar6 = 0;
  if (sVar1 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    lVar4 = lVar4 + sVar2 + 2;
  }
  this->_dilationfactor_cached_byte_size_ = iVar5;
  lVar4 = lVar4 + sVar1;
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar1 != 0) {
    iVar6 = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar6);
    lVar4 = lVar4 + sVar2 + 2;
  }
  this->_outputshape_cached_byte_size_ = iVar6;
  sVar1 = lVar4 + sVar1;
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->weights_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->bias_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->outputchannels_ != 0) {
    uVar3 = this->outputchannels_ | 1;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    sVar1 = sVar1 + ((int)lVar4 * 9 + 0x49U >> 6) + 1;
  }
  if (this->kernelchannels_ != 0) {
    uVar3 = this->kernelchannels_ | 1;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    sVar1 = sVar1 + ((int)lVar4 * 9 + 0x49U >> 6) + 1;
  }
  if (this->ngroups_ != 0) {
    uVar3 = this->ngroups_ | 1;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    sVar1 = sVar1 + ((int)lVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = sVar1 + 3;
  if (this->isdeconvolution_ == false) {
    sVar2 = sVar1;
  }
  sVar1 = sVar2 + 3;
  if (this->hasbias_ == false) {
    sVar1 = sVar2;
  }
  if (this->_oneof_case_[0] == 0x33) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SamePadding>
                      ((this->ConvolutionPaddingType_).same_);
  }
  else {
    if (this->_oneof_case_[0] != 0x32) goto LAB_001b1252;
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ValidPadding>
                      ((this->ConvolutionPaddingType_).valid_);
  }
  sVar1 = sVar1 + sVar2 + 2;
LAB_001b1252:
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t ConvolutionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ConvolutionLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 30;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 dilationFactor = 40;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->dilationfactor_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _dilationfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 outputShape = 100;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputchannels());
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->kernelchannels());
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->ngroups());
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    total_size += 2 + 1;
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    total_size += 2 + 1;
  }

  switch (ConvolutionPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 50;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ConvolutionPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 51;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ConvolutionPaddingType_.same_);
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}